

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

bool Js::JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties
               (RecyclableObject *object)

{
  bool bVar1;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_20;
  
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
            (&local_20,
             &((((object->type).ptr)->javascriptLibrary).ptr)->typesWithNoSpecialPropertyProtoChain)
  ;
  bVar1 = PrototypeChainCache<Js::NoSpecialPropertyCache>::Check(local_20.ptr,object);
  return bVar1;
}

Assistant:

bool JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(_In_ RecyclableObject* object)
    {
        return object->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Check(object);
    }